

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viewer.cpp
# Opt level: O0

int __thiscall CS248::Viewer::init(Viewer *this,EVP_PKEY_CTX *ctx)

{
  Color color;
  Color color_00;
  int iVar1;
  GLenum GVar2;
  ostream *poVar3;
  void *pvVar4;
  char *title_00;
  OSDText *pOVar5;
  string title;
  int in_stack_fffffffffffffe58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe60;
  char *in_stack_fffffffffffffe68;
  allocator *paVar6;
  OSDText *in_stack_fffffffffffffea0;
  size_t in_stack_fffffffffffffec8;
  string *in_stack_fffffffffffffed0;
  undefined8 in_stack_fffffffffffffed8;
  OSDText *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined8 in_stack_fffffffffffffef0;
  Color local_cc;
  allocator local_b9;
  string local_b8 [36];
  Color local_94;
  allocator local_81;
  string local_80 [34];
  byte local_5e;
  allocator local_5d [20];
  byte local_49;
  string local_48 [32];
  string local_28 [32];
  Viewer *local_8;
  
  local_8 = this;
  glfwSetErrorCallback(err_callback);
  iVar1 = glfwInit();
  if (iVar1 == 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CS248] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Error: could not initialize GLFW!");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    exit(1);
  }
  local_49 = 0;
  local_5e = 0;
  if (renderer == (Renderer *)0x0) {
    std::allocator<char>::allocator();
    local_5e = 1;
    std::__cxx11::string::string(local_28,"CS248",local_5d);
  }
  else {
    (*renderer->_vptr_Renderer[5])();
    local_49 = 1;
    std::operator+(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60);
  }
  if ((local_5e & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)local_5d);
  }
  if ((local_49 & 1) != 0) {
    std::__cxx11::string::~string(local_48);
  }
  title_00 = (char *)std::__cxx11::string::c_str();
  window = glfwCreateWindow(0x3c0,0x280,title_00,(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
  if (window == (GLFWwindow *)0x0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CS248] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Error: could not create window!");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    glfwTerminate();
    exit(1);
  }
  glfwMakeContextCurrent(window);
  glfwSwapInterval(1);
  glfwSetFramebufferSizeCallback(window,resize_callback);
  glfwSetKeyCallback(window,key_callback);
  glfwSetCharCallback(window,char_callback);
  glfwSetCursorPosCallback(window,cursor_callback);
  glfwSetScrollCallback(window,scroll_callback);
  glfwSetInputMode(window,0x33003,1);
  glfwSetMouseButtonCallback(window,mouse_button_callback);
  GVar2 = glewInit();
  if (GVar2 != 0) {
    poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
    poVar3 = std::operator<<(poVar3,"[CS248] ");
    poVar3 = std::operator<<(poVar3,"\x1b[0m");
    poVar3 = std::operator<<(poVar3,"Error: could not initialize GLEW!");
    pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
    glfwTerminate();
    exit(1);
  }
  glEnable(0xbe2);
  glBlendFunc(0x302,0x303);
  glfwGetFramebufferSize(window,(int *)&buffer_w,(int *)&buffer_h);
  if (0x3c0 < buffer_w) {
    HDPI = 1;
  }
  if (renderer != (Renderer *)0x0) {
    if ((HDPI & 1) != 0) {
      Renderer::use_hdpi_reneder_target(renderer);
    }
    (*renderer->_vptr_Renderer[2])();
  }
  pOVar5 = (OSDText *)operator_new(0x60);
  OSDText::OSDText(in_stack_fffffffffffffea0);
  osd_text = pOVar5;
  iVar1 = OSDText::init(pOVar5,(EVP_PKEY_CTX *)(ulong)(HDPI & 1));
  if (-1 < iVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_80,"Renderer",&local_81);
    Color::Color(&local_94,0.15,0.5,0.15,1.0);
    color.g = (float)GVar2;
    color.r = (float)in_stack_fffffffffffffee8;
    color.b = (float)(int)in_stack_fffffffffffffef0;
    color.a = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    line_id_renderer =
         OSDText::add_line(in_stack_fffffffffffffee0,
                           (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                           (float)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,color);
    std::__cxx11::string::~string(local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
    paVar6 = &local_b9;
    pOVar5 = osd_text;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,"Framerate",paVar6);
    Color::Color(&local_cc,0.15,0.5,0.15,1.0);
    color_00.g = (float)GVar2;
    color_00.r = (float)in_stack_fffffffffffffee8;
    color_00.b = (float)(int)in_stack_fffffffffffffef0;
    color_00.a = (float)(int)((ulong)in_stack_fffffffffffffef0 >> 0x20);
    line_id_framerate =
         OSDText::add_line(in_stack_fffffffffffffee0,
                           (float)((ulong)in_stack_fffffffffffffed8 >> 0x20),
                           (float)in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
                           in_stack_fffffffffffffec8,color_00);
    iVar1 = line_id_framerate;
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    resize_callback((GLFWwindow *)pOVar5,iVar1,in_stack_fffffffffffffe58);
    iVar1 = std::__cxx11::string::~string(local_28);
    return iVar1;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"\x1b[31m");
  poVar3 = std::operator<<(poVar3,"[CS248] ");
  poVar3 = std::operator<<(poVar3,"\x1b[0m");
  poVar3 = std::operator<<(poVar3,"Error: could not initialize on-screen display!");
  pvVar4 = (void *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(pvVar4,std::flush<char,std::char_traits<char>>);
  exit(1);
}

Assistant:

void Viewer::init() {

  // initialize glfw
  glfwSetErrorCallback( err_callback );
  if( !glfwInit() ) {
    out_err("Error: could not initialize GLFW!");
    exit( 1 );
  }

  // create window
  string title = renderer ? "CS248: " + renderer->name() : "CS248";
  window = glfwCreateWindow( DEFAULT_W, DEFAULT_H, title.c_str(), NULL, NULL );
  if (!window) {
    out_err("Error: could not create window!");
    glfwTerminate();
    exit( 1 );
  }

  // set context
  glfwMakeContextCurrent( window );
  glfwSwapInterval(1);

  // framebuffer event callbacks
  glfwSetFramebufferSizeCallback( window, resize_callback );
  
  // key event callbacks
  glfwSetKeyCallback( window, key_callback );

  // character event callbacks
  glfwSetCharCallback( window, char_callback );
  
  // cursor event callbacks
  glfwSetCursorPosCallback( window, cursor_callback );

  // wheel event callbacks
  glfwSetScrollCallback(window, scroll_callback);  
  
  // mouse button callbacks
  glfwSetInputMode(window, GLFW_STICKY_MOUSE_BUTTONS, 1);
  glfwSetMouseButtonCallback(window, mouse_button_callback);

  // initialize glew
  if (glewInit() != GLEW_OK) {
    out_err("Error: could not initialize GLEW!");
    glfwTerminate();
    exit( 1 );
  }

  // enable alpha blending
  glEnable(GL_BLEND);
  glBlendFunc(GL_SRC_ALPHA, GL_ONE_MINUS_SRC_ALPHA);

  // resize components to current window size, get DPI
  glfwGetFramebufferSize(window, (int*) &buffer_w, (int*) &buffer_h );
  if( buffer_w > DEFAULT_W ) HDPI = true;

  // initialize renderer if already set
  if (renderer){
    if (HDPI) renderer->use_hdpi_reneder_target();
    renderer->init();
  } 

  // initialize status OSD
  osd_text = new OSDText();
  if (osd_text->init(HDPI) < 0) {
    out_err("Error: could not initialize on-screen display!");
    exit( 1 );
  }
  
  // add lines for renderer and fps
  line_id_renderer  = osd_text->add_line(-0.95,  0.90, "Renderer", 
                                          18, Color(0.15, 0.5, 0.15));
  line_id_framerate = osd_text->add_line(-0.98, -0.96, "Framerate", 
                                          14, Color(0.15, 0.5, 0.15));

  // resize elements to current size
  resize_callback(window, buffer_w, buffer_h);

}